

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftplistparser.c
# Opt level: O1

size_t Curl_ftp_parselist(char *buffer,size_t size,size_t nmemb,void *connptr)

{
  size_t *psVar1;
  uint *puVar2;
  byte *pbVar3;
  byte bVar4;
  byte bVar5;
  int *piVar6;
  size_t sVar7;
  long lVar8;
  uint uVar9;
  curlfiletype cVar10;
  int iVar11;
  char *pcVar12;
  fileinfo *pfVar13;
  void *pvVar14;
  long lVar15;
  ushort **ppuVar16;
  int *piVar17;
  size_t __n;
  ulong uVar18;
  ulong uVar19;
  byte *pbVar20;
  ulong uVar21;
  bool bVar22;
  char *p;
  size_t local_50;
  char *local_40;
  size_t local_38;
  
  uVar18 = size * nmemb;
  piVar6 = (int *)**(undefined8 **)(*connptr + 0x4f48);
  sVar7 = uVar18;
  if (piVar6[3] == 0) {
    if ((uVar18 != 0) && (*piVar6 == 0)) {
      *piVar6 = ((byte)(*buffer - 0x30U) < 10) + 1;
    }
    local_38 = uVar18 + 1;
    uVar21 = 0;
    do {
      if (uVar18 <= uVar21) {
        return uVar18;
      }
      bVar4 = buffer[uVar21];
      if (*(long *)(piVar6 + 4) == 0) {
        pfVar13 = Curl_fileinfo_alloc();
        *(fileinfo **)(piVar6 + 4) = pfVar13;
        if (pfVar13 == (fileinfo *)0x0) {
          piVar6[3] = 0x1b;
        }
        else {
          pvVar14 = (*Curl_cmalloc)(0xa0);
          lVar15 = *(long *)(piVar6 + 4);
          *(void **)(lVar15 + 0x68) = pvVar14;
          if (pvVar14 != (void *)0x0) {
            *(undefined8 *)(lVar15 + 0x70) = 0xa0;
            piVar6[8] = 0;
            piVar6[9] = 0;
            piVar6[6] = 0;
            goto LAB_0062214b;
          }
          lVar15 = **(long **)(*connptr + 0x4f48);
          if (*(void **)(lVar15 + 0x10) != (void *)0x0) {
            Curl_fileinfo_dtor((void *)0x0,*(void **)(lVar15 + 0x10));
          }
          *(undefined8 *)(lVar15 + 0x10) = 0;
          *(undefined4 *)(lVar15 + 0xc) = 0x1b;
        }
        goto LAB_00622353;
      }
LAB_0062214b:
      pfVar13 = *(fileinfo **)(piVar6 + 4);
      sVar7 = (pfVar13->info).b_used;
      (pfVar13->info).b_used = sVar7 + 1;
      (pfVar13->info).b_data[sVar7] = bVar4;
      sVar7 = (pfVar13->info).b_size;
      if (sVar7 - 1 <= (pfVar13->info).b_used) {
        pcVar12 = (char *)(*Curl_crealloc)((pfVar13->info).b_data,sVar7 + 0xa0);
        if (pcVar12 == (char *)0x0) {
          Curl_fileinfo_dtor((void *)0x0,*(void **)(piVar6 + 4));
          piVar6[4] = 0;
          piVar6[5] = 0;
          piVar6[3] = 0x1b;
          lVar15 = **(long **)(*connptr + 0x4f48);
          if (*(void **)(lVar15 + 0x10) != (void *)0x0) {
            Curl_fileinfo_dtor((void *)0x0,*(void **)(lVar15 + 0x10));
          }
          *(undefined8 *)(lVar15 + 0x10) = 0;
          *(undefined4 *)(lVar15 + 0xc) = 0x1b;
          local_50 = uVar18;
        }
        else {
          psVar1 = &(pfVar13->info).b_size;
          *psVar1 = *psVar1 + 0xa0;
          (pfVar13->info).b_data = pcVar12;
        }
        if (pcVar12 != (char *)0x0) goto LAB_0062224f;
LAB_00622308:
        bVar22 = false;
        goto LAB_00622c53;
      }
LAB_0062224f:
      uVar19 = (ulong)bVar4;
      if (*piVar6 == 2) {
        switch(piVar6[1]) {
        case 0:
          uVar9 = piVar6[6] + 1;
          piVar6[6] = uVar9;
          if (uVar9 < 9) {
            __n = 0xc;
            pcVar12 = "0123456789-";
LAB_00622577:
            pvVar14 = memchr(pcVar12,(int)(char)bVar4,__n);
            bVar22 = pvVar14 == (void *)0x0;
LAB_0062257f:
            if (bVar22) goto LAB_0062258a;
          }
          else {
            if ((uVar9 != 9) || (bVar4 != 0x20)) goto LAB_0062258a;
            piVar6[1] = 1;
            piVar6[2] = 0;
          }
          break;
        case 1:
          iVar11 = piVar6[6];
          piVar6[6] = iVar11 + 1U;
          if (piVar6[2] == 1) {
            if (bVar4 == 0x20) {
              *(long *)(piVar6 + 0x10) = *(long *)(piVar6 + 8);
              (pfVar13->info).b_data[((ulong)(iVar11 + 1U) - 1) + *(long *)(piVar6 + 8)] = '\0';
              piVar6[1] = 2;
              piVar6[2] = 0;
LAB_006227b0:
              piVar6[6] = 0;
            }
            else {
              pvVar14 = memchr("APM0123456789:",(int)(char)bVar4,0xf);
              if (pvVar14 == (void *)0x0) goto LAB_00622cfa;
            }
          }
          else if ((piVar6[2] == 0) &&
                  (ppuVar16 = __ctype_b_loc(),
                  (*(byte *)((long)*ppuVar16 + uVar19 * 2 + 1) & 0x20) == 0)) goto LAB_00622497;
          break;
        case 2:
          iVar11 = piVar6[2];
          if (iVar11 != 1) goto LAB_0062275c;
          iVar11 = piVar6[6];
          piVar6[6] = iVar11 + 1U;
          if (bVar4 != 0x20) break;
          (pfVar13->info).b_data[((ulong)(iVar11 + 1U) - 1) + *(long *)(piVar6 + 8)] = '\0';
          pcVar12 = (pfVar13->info).b_data + *(long *)(piVar6 + 8);
          iVar11 = strcmp("<DIR>",pcVar12);
          if (iVar11 == 0) {
            (pfVar13->info).filetype = CURLFILETYPE_DIRECTORY;
            (pfVar13->info).size = 0;
          }
          else {
            lVar15 = strtol(pcVar12,&local_40,10);
            (pfVar13->info).size = lVar15;
            if (*local_40 == '\0') {
              if ((lVar15 + 0x8000000000000001U < 2) &&
                 (piVar17 = __errno_location(), *piVar17 == 0x22)) {
                lVar15 = **(long **)(*connptr + 0x4f48);
                pvVar14 = *(void **)(lVar15 + 0x10);
                goto joined_r0x00622d95;
              }
              *(undefined4 *)(*(long *)(piVar6 + 4) + 8) = 0;
              bVar22 = true;
            }
            else {
              lVar15 = **(long **)(*connptr + 0x4f48);
              pvVar14 = *(void **)(lVar15 + 0x10);
joined_r0x00622d95:
              if (pvVar14 != (void *)0x0) {
                Curl_fileinfo_dtor((void *)0x0,pvVar14);
              }
              *(undefined8 *)(lVar15 + 0x10) = 0;
              *(undefined4 *)(lVar15 + 0xc) = 0x57;
              bVar22 = false;
              local_50 = uVar18;
            }
            if (!bVar22) goto LAB_00622ea8;
          }
          *(uint *)(*(long *)(piVar6 + 4) + 0x60) = *(uint *)(*(long *)(piVar6 + 4) + 0x60) | 0x40;
          piVar6[6] = 0;
          piVar6[1] = 3;
          piVar6[2] = 0;
          break;
        case 3:
          iVar11 = piVar6[2];
          if (iVar11 == 2) {
            if (bVar4 != 10) goto LAB_00622cfa;
          }
          else {
            if (iVar11 != 1) goto LAB_0062275c;
            piVar6[6] = piVar6[6] + 1;
            if (bVar4 != 10) {
              if (bVar4 == 0xd) {
                piVar6[2] = 2;
                (pfVar13->info).b_data[(pfVar13->info).b_used - 1] = '\0';
              }
              break;
            }
            *(undefined8 *)(piVar6 + 10) = *(undefined8 *)(piVar6 + 8);
            (pfVar13->info).b_data[(pfVar13->info).b_used - 1] = '\0';
          }
          *(undefined8 *)(piVar6 + 10) = *(undefined8 *)(piVar6 + 8);
          ftp_pl_insert_finfo((connectdata *)connptr,pfVar13);
          piVar6[1] = 0;
          piVar6[2] = 0;
        }
        goto switchD_00622284_default;
      }
      if (*piVar6 != 1) {
        local_50 = local_38;
        goto LAB_00622308;
      }
      switch(piVar6[1]) {
      case 0:
        if (piVar6[2] == 1) {
          uVar9 = piVar6[6];
          piVar6[6] = uVar9 + 1;
          if (bVar4 == 10) {
            (pfVar13->info).b_data[uVar9] = '\0';
            pcVar12 = (pfVar13->info).b_data;
            iVar11 = strncmp("total ",pcVar12,6);
            if (iVar11 != 0) goto LAB_00622ca8;
            ppuVar16 = __ctype_b_loc();
            pbVar20 = (byte *)(pcVar12 + 5);
            do {
              pbVar3 = pbVar20 + 1;
              pbVar20 = pbVar20 + 1;
            } while ((*(byte *)((long)*ppuVar16 + (ulong)*pbVar3 * 2 + 1) & 0x20) != 0);
            do {
              bVar4 = *pbVar20;
              pbVar20 = pbVar20 + 1;
            } while ((*(byte *)((long)*ppuVar16 + (ulong)bVar4 * 2 + 1) & 8) != 0);
            if (bVar4 == 0) {
              piVar6[1] = 1;
              (pfVar13->info).b_used = 0;
            }
            else {
              lVar15 = **(long **)(*connptr + 0x4f48);
              if (*(void **)(lVar15 + 0x10) != (void *)0x0) {
                Curl_fileinfo_dtor((void *)0x0,*(void **)(lVar15 + 0x10));
              }
              *(undefined8 *)(lVar15 + 0x10) = 0;
              *(undefined4 *)(lVar15 + 0xc) = 0x57;
              local_50 = uVar18;
            }
            if (bVar4 != 0) goto LAB_00622ea8;
          }
          else if (bVar4 == 0xd) {
            piVar6[6] = uVar9;
            psVar1 = &(pfVar13->info).b_used;
            *psVar1 = *psVar1 - 1;
          }
        }
        else if (piVar6[2] == 0) {
          if (bVar4 == 0x74) {
            piVar6[2] = 1;
            piVar6[6] = piVar6[6] + 1;
          }
          else {
            piVar6[1] = 1;
            (pfVar13->info).b_used = 0;
            uVar21 = uVar21 - 1;
          }
        }
        break;
      case 1:
        if (bVar4 < 100) {
          if (bVar4 < 0x62) {
            cVar10 = CURLFILETYPE_FILE;
            if (bVar4 != 0x2d) {
              if (bVar4 != 0x44) {
LAB_00622ca8:
                lVar15 = **(long **)(*connptr + 0x4f48);
                if (*(void **)(lVar15 + 0x10) != (void *)0x0) {
                  Curl_fileinfo_dtor((void *)0x0,*(void **)(lVar15 + 0x10));
                }
                *(undefined8 *)(lVar15 + 0x10) = 0;
                *(undefined4 *)(lVar15 + 0xc) = 0x57;
                local_50 = uVar18;
                goto LAB_00622308;
              }
              cVar10 = CURLFILETYPE_DOOR;
            }
          }
          else if (bVar4 == 0x62) {
            cVar10 = CURLFILETYPE_DEVICE_BLOCK;
          }
          else {
            if (bVar4 != 99) goto LAB_00622ca8;
            cVar10 = CURLFILETYPE_DEVICE_CHAR;
          }
        }
        else if (bVar4 < 0x70) {
          if (bVar4 == 100) {
            cVar10 = CURLFILETYPE_DIRECTORY;
          }
          else {
            if (bVar4 != 0x6c) goto LAB_00622ca8;
            cVar10 = CURLFILETYPE_SYMLINK;
          }
        }
        else if (bVar4 == 0x70) {
          cVar10 = CURLFILETYPE_NAMEDPIPE;
        }
        else {
          if (bVar4 != 0x73) goto LAB_00622ca8;
          cVar10 = CURLFILETYPE_SOCKET;
        }
        (pfVar13->info).filetype = cVar10;
        piVar6[1] = 2;
        piVar6[6] = 0;
        piVar6[8] = 1;
        piVar6[9] = 0;
        break;
      case 2:
        uVar9 = piVar6[6] + 1;
        piVar6[6] = uVar9;
        if (uVar9 < 10) {
          __n = 9;
          pcVar12 = "rwx-tTsS";
          goto LAB_00622577;
        }
        if (uVar9 == 10) {
          if (bVar4 == 0x20) {
            (pfVar13->info).b_data[10] = '\0';
            lVar15 = *(long *)(piVar6 + 8);
            uVar9 = ftp_pl_get_permission((pfVar13->info).b_data + lVar15);
            if (uVar9 < 0x1000000) {
              lVar8 = *(long *)(piVar6 + 4);
              puVar2 = (uint *)(lVar8 + 0x60);
              *puVar2 = *puVar2 | 8;
              *(uint *)(lVar8 + 0x18) = uVar9;
              *(long *)(piVar6 + 0x12) = lVar15;
              piVar6[6] = 0;
              piVar6[1] = 3;
              piVar6[2] = 0;
              bVar22 = true;
            }
            else {
              lVar15 = **(long **)(*connptr + 0x4f48);
              if (*(void **)(lVar15 + 0x10) != (void *)0x0) {
                Curl_fileinfo_dtor((void *)0x0,*(void **)(lVar15 + 0x10));
              }
              *(undefined8 *)(lVar15 + 0x10) = 0;
              *(undefined4 *)(lVar15 + 0xc) = 0x57;
              bVar22 = false;
              local_50 = uVar18;
            }
          }
          else {
            lVar15 = **(long **)(*connptr + 0x4f48);
            if (*(void **)(lVar15 + 0x10) != (void *)0x0) {
              Curl_fileinfo_dtor((void *)0x0,*(void **)(lVar15 + 0x10));
            }
            *(undefined8 *)(lVar15 + 0x10) = 0;
            *(undefined4 *)(lVar15 + 0xc) = 0x57;
            bVar22 = false;
            local_50 = uVar18;
          }
          if (!bVar22) {
LAB_00622ea8:
            bVar22 = false;
            goto LAB_00622c53;
          }
        }
        break;
      case 3:
        iVar11 = piVar6[2];
        if (iVar11 == 1) {
          iVar11 = piVar6[6];
          piVar6[6] = iVar11 + 1U;
          if (bVar4 == 0x20) {
            (pfVar13->info).b_data[((ulong)(iVar11 + 1U) - 1) + *(long *)(piVar6 + 8)] = '\0';
            lVar15 = strtol((pfVar13->info).b_data + *(long *)(piVar6 + 8),&local_40,10);
            if ((*local_40 == '\0') && (lVar15 + 0x7fffffffffffffffU < 0xfffffffffffffffe)) {
              lVar8 = *(long *)(piVar6 + 4);
              puVar2 = (uint *)(lVar8 + 0x60);
              *puVar2 = *puVar2 | 0x80;
              *(long *)(lVar8 + 0x30) = lVar15;
            }
            piVar6[6] = 0;
            piVar6[8] = 0;
            piVar6[9] = 0;
            piVar6[1] = 4;
            piVar6[2] = 0;
          }
          else if ((byte)(bVar4 - 0x3a) < 0xf6) goto LAB_0062258a;
        }
        else {
LAB_00622725:
          if ((iVar11 == 0) && (bVar4 != 0x20)) {
            if ((byte)(bVar4 - 0x30) < 10) goto LAB_0062276e;
            goto LAB_00622cfa;
          }
        }
        break;
      case 4:
        iVar11 = piVar6[2];
        if (iVar11 == 1) {
          iVar11 = piVar6[6];
          piVar6[6] = iVar11 + 1U;
          if (bVar4 == 0x20) {
            (pfVar13->info).b_data[((ulong)(iVar11 + 1U) - 1) + *(long *)(piVar6 + 8)] = '\0';
            *(undefined8 *)(piVar6 + 0xc) = *(undefined8 *)(piVar6 + 8);
            piVar6[1] = 5;
            piVar6[2] = 0;
LAB_0062270b:
            piVar6[8] = 0;
            piVar6[9] = 0;
            goto LAB_006227b0;
          }
        }
        else {
LAB_0062275c:
          if (iVar11 == 0) goto switchD_0062252a_caseD_0;
        }
        break;
      case 5:
        iVar11 = piVar6[2];
        if (iVar11 != 1) goto LAB_0062275c;
        iVar11 = piVar6[6];
        piVar6[6] = iVar11 + 1U;
        if (bVar4 == 0x20) {
          (pfVar13->info).b_data[((ulong)(iVar11 + 1U) - 1) + *(long *)(piVar6 + 8)] = '\0';
          *(undefined8 *)(piVar6 + 0xe) = *(undefined8 *)(piVar6 + 8);
          piVar6[1] = 6;
          piVar6[2] = 0;
          goto LAB_0062270b;
        }
        break;
      case 6:
        iVar11 = piVar6[2];
        if (iVar11 != 1) goto LAB_00622725;
        iVar11 = piVar6[6];
        piVar6[6] = iVar11 + 1U;
        if (bVar4 != 0x20) {
          ppuVar16 = __ctype_b_loc();
          bVar22 = (*(byte *)((long)*ppuVar16 + uVar19 * 2 + 1) & 8) == 0;
          goto LAB_0062257f;
        }
        (pfVar13->info).b_data[((ulong)(iVar11 + 1U) - 1) + *(long *)(piVar6 + 8)] = '\0';
        lVar15 = strtol((pfVar13->info).b_data + *(long *)(piVar6 + 8),&local_40,10);
        if ((*local_40 == '\0') && (lVar15 + 0x7fffffffffffffffU < 0xfffffffffffffffe)) {
          lVar8 = *(long *)(piVar6 + 4);
          puVar2 = (uint *)(lVar8 + 0x60);
          *puVar2 = *puVar2 | 0x40;
          *(long *)(lVar8 + 0x28) = lVar15;
        }
        piVar6[6] = 0;
        piVar6[8] = 0;
        piVar6[9] = 0;
        piVar6[1] = 7;
        piVar6[2] = 0;
        break;
      case 7:
        switch(piVar6[2]) {
        case 0:
          if (bVar4 != 0x20) {
            ppuVar16 = __ctype_b_loc();
            if (((*ppuVar16)[uVar19] & 8) == 0) goto LAB_00622cfa;
            goto LAB_0062276e;
          }
          break;
        case 1:
          piVar6[6] = piVar6[6] + 1;
          if (bVar4 == 0x20) {
LAB_00622aab:
            piVar6[2] = 2;
          }
          else {
            ppuVar16 = __ctype_b_loc();
            bVar5 = (byte)(*ppuVar16)[uVar19];
joined_r0x00622a92:
            if (((bVar5 & 8) == 0) && (bVar4 != 0x2e)) goto LAB_0062258a;
          }
          break;
        case 2:
          piVar6[6] = piVar6[6] + 1;
          if (bVar4 != 0x20) {
            ppuVar16 = __ctype_b_loc();
            if (((*ppuVar16)[uVar19] & 8) == 0) goto LAB_0062258a;
LAB_00622bdf:
            piVar6[2] = 3;
          }
          break;
        case 3:
          piVar6[6] = piVar6[6] + 1;
          if (bVar4 != 0x20) {
            ppuVar16 = __ctype_b_loc();
            bVar5 = (byte)(*ppuVar16)[uVar19];
            goto joined_r0x00622a92;
          }
LAB_00622c10:
          piVar6[2] = 4;
          break;
        case 4:
          piVar6[6] = piVar6[6] + 1;
          if (bVar4 != 0x20) {
            ppuVar16 = __ctype_b_loc();
            if (((*ppuVar16)[uVar19] & 8) == 0) goto LAB_0062258a;
            piVar6[2] = 5;
          }
          break;
        case 5:
          iVar11 = piVar6[6];
          piVar6[6] = iVar11 + 1U;
          if (bVar4 == 0x20) {
            (pfVar13->info).b_data[((ulong)(iVar11 + 1U) - 1) + *(long *)(piVar6 + 8)] = '\0';
            *(undefined8 *)(piVar6 + 0x10) = *(undefined8 *)(piVar6 + 8);
            if ((pfVar13->info).filetype == CURLFILETYPE_SYMLINK) {
              piVar6[1] = 9;
              piVar6[2] = 0;
            }
            else {
              piVar6[1] = 8;
              piVar6[2] = 0;
            }
          }
          else {
            ppuVar16 = __ctype_b_loc();
            if (((((*ppuVar16)[uVar19] & 8) == 0) && (bVar4 != 0x2e)) && (bVar4 != 0x3a))
            goto LAB_0062258a;
          }
        }
        break;
      case 8:
        iVar11 = piVar6[2];
        if (iVar11 == 2) {
          if (bVar4 != 10) goto LAB_00622cfa;
          (pfVar13->info).b_data[((ulong)(uint)piVar6[6] - 1) + *(long *)(piVar6 + 8)] = '\0';
        }
        else {
          if (iVar11 != 1) goto LAB_0062275c;
          iVar11 = piVar6[6];
          piVar6[6] = iVar11 + 1U;
          if (bVar4 != 10) {
            if (bVar4 == 0xd) goto LAB_00622aab;
            break;
          }
          (pfVar13->info).b_data[((ulong)(iVar11 + 1U) - 1) + *(long *)(piVar6 + 8)] = '\0';
        }
        *(undefined8 *)(piVar6 + 10) = *(undefined8 *)(piVar6 + 8);
        piVar6[1] = 1;
        ftp_pl_insert_finfo((connectdata *)connptr,pfVar13);
        break;
      case 9:
        switch(piVar6[2]) {
        case 0:
switchD_0062252a_caseD_0:
          if (bVar4 != 0x20) {
LAB_0062276e:
            *(size_t *)(piVar6 + 8) = (pfVar13->info).b_used - 1;
            piVar6[6] = 1;
            piVar6[2] = 1;
          }
          break;
        case 1:
          piVar6[6] = piVar6[6] + 1;
          if ((bVar4 == 10) || (bVar4 == 0xd)) goto LAB_0062258a;
          if (bVar4 == 0x20) {
            piVar6[2] = 2;
          }
          break;
        case 2:
          piVar6[6] = piVar6[6] + 1;
          if ((bVar4 == 10) || (bVar4 == 0xd)) goto LAB_0062258a;
          if (bVar4 == 0x2d) goto LAB_00622bdf;
LAB_00622497:
          piVar6[2] = 1;
          break;
        case 3:
          piVar6[6] = piVar6[6] + 1;
          if ((bVar4 != 10) && (bVar4 != 0xd)) {
            if (bVar4 == 0x3e) goto LAB_00622c10;
            goto LAB_00622497;
          }
LAB_0062258a:
          lVar15 = **(long **)(*connptr + 0x4f48);
          pvVar14 = *(void **)(lVar15 + 0x10);
          goto joined_r0x00622d18;
        case 4:
          iVar11 = piVar6[6];
          piVar6[6] = iVar11 + 1U;
          if ((bVar4 == 10) || (bVar4 == 0xd)) goto LAB_00622ca8;
          if (bVar4 == 0x20) {
            piVar6[2] = 5;
            (pfVar13->info).b_data[((ulong)(iVar11 + 1U) - 4) + *(long *)(piVar6 + 8)] = '\0';
            *(undefined8 *)(piVar6 + 10) = *(undefined8 *)(piVar6 + 8);
            piVar6[6] = 0;
            piVar6[8] = 0;
            piVar6[9] = 0;
          }
          else {
            piVar6[2] = 1;
          }
          break;
        case 5:
          if ((bVar4 == 10) || (bVar4 == 0xd)) goto LAB_00622cfa;
          piVar6[2] = 6;
          *(size_t *)(piVar6 + 8) = (pfVar13->info).b_used - 1;
          piVar6[6] = 1;
          break;
        case 6:
          iVar11 = piVar6[6];
          piVar6[6] = iVar11 + 1U;
          if (bVar4 == 10) {
            (pfVar13->info).b_data[((ulong)(iVar11 + 1U) - 1) + *(long *)(piVar6 + 8)] = '\0';
LAB_00622f32:
            *(undefined8 *)(piVar6 + 0x14) = *(undefined8 *)(piVar6 + 8);
            ftp_pl_insert_finfo((connectdata *)connptr,pfVar13);
            piVar6[1] = 1;
          }
          else if (bVar4 == 0xd) {
            piVar6[2] = 7;
          }
          break;
        case 7:
          if (bVar4 == 10) {
            (pfVar13->info).b_data[((ulong)(uint)piVar6[6] - 1) + *(long *)(piVar6 + 8)] = '\0';
            goto LAB_00622f32;
          }
LAB_00622cfa:
          lVar15 = **(long **)(*connptr + 0x4f48);
          pvVar14 = *(void **)(lVar15 + 0x10);
joined_r0x00622d18:
          if (pvVar14 != (void *)0x0) {
            Curl_fileinfo_dtor((void *)0x0,pvVar14);
          }
          *(undefined8 *)(lVar15 + 0x10) = 0;
          *(undefined4 *)(lVar15 + 0xc) = 0x57;
LAB_00622353:
          bVar22 = false;
          local_50 = uVar18;
          goto LAB_00622c53;
        }
      }
switchD_00622284_default:
      uVar21 = uVar21 + 1;
      bVar22 = true;
LAB_00622c53:
      sVar7 = local_50;
    } while (bVar22);
  }
  local_50 = sVar7;
  return local_50;
}

Assistant:

size_t Curl_ftp_parselist(char *buffer, size_t size, size_t nmemb,
                          void *connptr)
{
  size_t bufflen = size*nmemb;
  struct connectdata *conn = (struct connectdata *)connptr;
  struct ftp_wc_tmpdata *tmpdata = conn->data->wildcard.tmp;
  struct ftp_parselist_data *parser = tmpdata->parser;
  struct fileinfo *infop;
  struct curl_fileinfo *finfo;
  unsigned long i = 0;
  CURLcode result;

  if(parser->error) { /* error in previous call */
    /* scenario:
     * 1. call => OK..
     * 2. call => OUT_OF_MEMORY (or other error)
     * 3. (last) call => is skipped RIGHT HERE and the error is hadled later
     *    in wc_statemach()
     */
    return bufflen;
  }

  if(parser->os_type == OS_TYPE_UNKNOWN && bufflen > 0) {
    /* considering info about FILE response format */
    parser->os_type = (buffer[0] >= '0' && buffer[0] <= '9') ?
                       OS_TYPE_WIN_NT : OS_TYPE_UNIX;
  }

  while(i < bufflen) { /* FSM */

    char c = buffer[i];
    if(!parser->file_data) { /* tmp file data is not allocated yet */
      parser->file_data = Curl_fileinfo_alloc();
      if(!parser->file_data) {
        parser->error = CURLE_OUT_OF_MEMORY;
        return bufflen;
      }
      parser->file_data->info.b_data = malloc(FTP_BUFFER_ALLOCSIZE);
      if(!parser->file_data->info.b_data) {
        PL_ERROR(conn, CURLE_OUT_OF_MEMORY);
        return bufflen;
      }
      parser->file_data->info.b_size = FTP_BUFFER_ALLOCSIZE;
      parser->item_offset = 0;
      parser->item_length = 0;
    }

    infop = parser->file_data;
    finfo = &infop->info;
    finfo->b_data[finfo->b_used++] = c;

    if(finfo->b_used >= finfo->b_size - 1) {
      /* if it is important, extend buffer space for file data */
      char *tmp = realloc(finfo->b_data,
                          finfo->b_size + FTP_BUFFER_ALLOCSIZE);
      if(tmp) {
        finfo->b_size += FTP_BUFFER_ALLOCSIZE;
        finfo->b_data = tmp;
      }
      else {
        Curl_fileinfo_dtor(NULL, parser->file_data);
        parser->file_data = NULL;
        parser->error = CURLE_OUT_OF_MEMORY;
        PL_ERROR(conn, CURLE_OUT_OF_MEMORY);
        return bufflen;
      }
    }

    switch(parser->os_type) {
    case OS_TYPE_UNIX:
      switch(parser->state.UNIX.main) {
      case PL_UNIX_TOTALSIZE:
        switch(parser->state.UNIX.sub.total_dirsize) {
        case PL_UNIX_TOTALSIZE_INIT:
          if(c == 't') {
            parser->state.UNIX.sub.total_dirsize = PL_UNIX_TOTALSIZE_READING;
            parser->item_length++;
          }
          else {
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
            /* start FSM again not considering size of directory */
            finfo->b_used = 0;
            i--;
          }
          break;
        case PL_UNIX_TOTALSIZE_READING:
          parser->item_length++;
          if(c == '\r') {
            parser->item_length--;
            finfo->b_used--;
          }
          else if(c == '\n') {
            finfo->b_data[parser->item_length - 1] = 0;
            if(strncmp("total ", finfo->b_data, 6) == 0) {
              char *endptr = finfo->b_data+6;
              /* here we can deal with directory size, pass the leading white
                 spaces and then the digits */
              while(ISSPACE(*endptr))
                endptr++;
              while(ISDIGIT(*endptr))
                endptr++;
              if(*endptr != 0) {
                PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
                return bufflen;
              }
              parser->state.UNIX.main = PL_UNIX_FILETYPE;
              finfo->b_used = 0;
            }
            else {
              PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
              return bufflen;
            }
          }
          break;
        }
        break;
      case PL_UNIX_FILETYPE:
        switch(c) {
        case '-':
          finfo->filetype = CURLFILETYPE_FILE;
          break;
        case 'd':
          finfo->filetype = CURLFILETYPE_DIRECTORY;
          break;
        case 'l':
          finfo->filetype = CURLFILETYPE_SYMLINK;
          break;
        case 'p':
          finfo->filetype = CURLFILETYPE_NAMEDPIPE;
          break;
        case 's':
          finfo->filetype = CURLFILETYPE_SOCKET;
          break;
        case 'c':
          finfo->filetype = CURLFILETYPE_DEVICE_CHAR;
          break;
        case 'b':
          finfo->filetype = CURLFILETYPE_DEVICE_BLOCK;
          break;
        case 'D':
          finfo->filetype = CURLFILETYPE_DOOR;
          break;
        default:
          PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
          return bufflen;
        }
        parser->state.UNIX.main = PL_UNIX_PERMISSION;
        parser->item_length = 0;
        parser->item_offset = 1;
        break;
      case PL_UNIX_PERMISSION:
        parser->item_length++;
        if(parser->item_length <= 9) {
          if(!strchr("rwx-tTsS", c)) {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
        }
        else if(parser->item_length == 10) {
          unsigned int perm;
          if(c != ' ') {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          finfo->b_data[10] = 0; /* terminate permissions */
          perm = ftp_pl_get_permission(finfo->b_data + parser->item_offset);
          if(perm & FTP_LP_MALFORMATED_PERM) {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          parser->file_data->info.flags |= CURLFINFOFLAG_KNOWN_PERM;
          parser->file_data->info.perm = perm;
          parser->offsets.perm = parser->item_offset;

          parser->item_length = 0;
          parser->state.UNIX.main = PL_UNIX_HLINKS;
          parser->state.UNIX.sub.hlinks = PL_UNIX_HLINKS_PRESPACE;
        }
        break;
      case PL_UNIX_HLINKS:
        switch(parser->state.UNIX.sub.hlinks) {
        case PL_UNIX_HLINKS_PRESPACE:
          if(c != ' ') {
            if(c >= '0' && c <= '9') {
              parser->item_offset = finfo->b_used - 1;
              parser->item_length = 1;
              parser->state.UNIX.sub.hlinks = PL_UNIX_HLINKS_NUMBER;
            }
            else {
              PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
              return bufflen;
            }
          }
          break;
        case PL_UNIX_HLINKS_NUMBER:
          parser->item_length ++;
          if(c == ' ') {
            char *p;
            long int hlinks;
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            hlinks = strtol(finfo->b_data + parser->item_offset, &p, 10);
            if(p[0] == '\0' && hlinks != LONG_MAX && hlinks != LONG_MIN) {
              parser->file_data->info.flags |= CURLFINFOFLAG_KNOWN_HLINKCOUNT;
              parser->file_data->info.hardlinks = hlinks;
            }
            parser->item_length = 0;
            parser->item_offset = 0;
            parser->state.UNIX.main = PL_UNIX_USER;
            parser->state.UNIX.sub.user = PL_UNIX_USER_PRESPACE;
          }
          else if(c < '0' || c > '9') {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          break;
        }
        break;
      case PL_UNIX_USER:
        switch(parser->state.UNIX.sub.user) {
        case PL_UNIX_USER_PRESPACE:
          if(c != ' ') {
            parser->item_offset = finfo->b_used - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.user = PL_UNIX_USER_PARSING;
          }
          break;
        case PL_UNIX_USER_PARSING:
          parser->item_length++;
          if(c == ' ') {
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.user = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_GROUP;
            parser->state.UNIX.sub.group = PL_UNIX_GROUP_PRESPACE;
            parser->item_offset = 0;
            parser->item_length = 0;
          }
          break;
        }
        break;
      case PL_UNIX_GROUP:
        switch(parser->state.UNIX.sub.group) {
        case PL_UNIX_GROUP_PRESPACE:
          if(c != ' ') {
            parser->item_offset = finfo->b_used - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.group = PL_UNIX_GROUP_NAME;
          }
          break;
        case PL_UNIX_GROUP_NAME:
          parser->item_length++;
          if(c == ' ') {
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.group = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_SIZE;
            parser->state.UNIX.sub.size = PL_UNIX_SIZE_PRESPACE;
            parser->item_offset = 0;
            parser->item_length = 0;
          }
          break;
        }
        break;
      case PL_UNIX_SIZE:
        switch(parser->state.UNIX.sub.size) {
        case PL_UNIX_SIZE_PRESPACE:
          if(c != ' ') {
            if(c >= '0' && c <= '9') {
              parser->item_offset = finfo->b_used - 1;
              parser->item_length = 1;
              parser->state.UNIX.sub.size = PL_UNIX_SIZE_NUMBER;
            }
            else {
              PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
              return bufflen;
            }
          }
          break;
        case PL_UNIX_SIZE_NUMBER:
          parser->item_length++;
          if(c == ' ') {
            char *p;
            curl_off_t fsize;
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            fsize = curlx_strtoofft(finfo->b_data+parser->item_offset, &p, 10);
            if(p[0] == '\0' && fsize != CURL_OFF_T_MAX &&
                               fsize != CURL_OFF_T_MIN) {
              parser->file_data->info.flags |= CURLFINFOFLAG_KNOWN_SIZE;
              parser->file_data->info.size = fsize;
            }
            parser->item_length = 0;
            parser->item_offset = 0;
            parser->state.UNIX.main = PL_UNIX_TIME;
            parser->state.UNIX.sub.time = PL_UNIX_TIME_PREPART1;
          }
          else if(!ISDIGIT(c)) {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          break;
        }
        break;
      case PL_UNIX_TIME:
        switch(parser->state.UNIX.sub.time) {
        case PL_UNIX_TIME_PREPART1:
          if(c != ' ') {
            if(ISALNUM(c)) {
              parser->item_offset = finfo->b_used -1;
              parser->item_length = 1;
              parser->state.UNIX.sub.time = PL_UNIX_TIME_PART1;
            }
            else {
              PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
              return bufflen;
            }
          }
          break;
        case PL_UNIX_TIME_PART1:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.time = PL_UNIX_TIME_PREPART2;
          }
          else if(!ISALNUM(c) && c != '.') {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          break;
        case PL_UNIX_TIME_PREPART2:
          parser->item_length++;
          if(c != ' ') {
            if(ISALNUM(c)) {
              parser->state.UNIX.sub.time = PL_UNIX_TIME_PART2;
            }
            else {
              PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
              return bufflen;
            }
          }
          break;
        case PL_UNIX_TIME_PART2:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.time = PL_UNIX_TIME_PREPART3;
          }
          else if(!ISALNUM(c) && c != '.') {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          break;
        case PL_UNIX_TIME_PREPART3:
          parser->item_length++;
          if(c != ' ') {
            if(ISALNUM(c)) {
              parser->state.UNIX.sub.time = PL_UNIX_TIME_PART3;
            }
            else {
              PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
              return bufflen;
            }
          }
          break;
        case PL_UNIX_TIME_PART3:
          parser->item_length++;
          if(c == ' ') {
            finfo->b_data[parser->item_offset + parser->item_length -1] = 0;
            parser->offsets.time = parser->item_offset;
            /*
              if(ftp_pl_gettime(parser, finfo->b_data + parser->item_offset)) {
                parser->file_data->flags |= CURLFINFOFLAG_KNOWN_TIME;
              }
            */
            if(finfo->filetype == CURLFILETYPE_SYMLINK) {
              parser->state.UNIX.main = PL_UNIX_SYMLINK;
              parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRESPACE;
            }
            else {
              parser->state.UNIX.main = PL_UNIX_FILENAME;
              parser->state.UNIX.sub.filename = PL_UNIX_FILENAME_PRESPACE;
            }
          }
          else if(!ISALNUM(c) && c != '.' && c != ':') {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          break;
        }
        break;
      case PL_UNIX_FILENAME:
        switch(parser->state.UNIX.sub.filename) {
        case PL_UNIX_FILENAME_PRESPACE:
          if(c != ' ') {
            parser->item_offset = finfo->b_used - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.filename = PL_UNIX_FILENAME_NAME;
          }
          break;
        case PL_UNIX_FILENAME_NAME:
          parser->item_length++;
          if(c == '\r') {
            parser->state.UNIX.sub.filename = PL_UNIX_FILENAME_WINDOWSEOL;
          }
          else if(c == '\n') {
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.filename = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
            result = ftp_pl_insert_finfo(conn, infop);
            if(result) {
              PL_ERROR(conn, result);
              return bufflen;
            }
          }
          break;
        case PL_UNIX_FILENAME_WINDOWSEOL:
          if(c == '\n') {
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.filename = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
            result = ftp_pl_insert_finfo(conn, infop);
            if(result) {
              PL_ERROR(conn, result);
              return bufflen;
            }
          }
          else {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          break;
        }
        break;
      case PL_UNIX_SYMLINK:
        switch(parser->state.UNIX.sub.symlink) {
        case PL_UNIX_SYMLINK_PRESPACE:
          if(c != ' ') {
            parser->item_offset = finfo->b_used - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_NAME:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET1;
          }
          else if(c == '\r' || c == '\n') {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET1:
          parser->item_length++;
          if(c == '-') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET2;
          }
          else if(c == '\r' || c == '\n') {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          else {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET2:
          parser->item_length++;
          if(c == '>') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET3;
          }
          else if(c == '\r' || c == '\n') {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          else {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET3:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET4;
            /* now place where is symlink following */
            finfo->b_data[parser->item_offset + parser->item_length - 4] = 0;
            parser->offsets.filename = parser->item_offset;
            parser->item_length = 0;
            parser->item_offset = 0;
          }
          else if(c == '\r' || c == '\n') {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          else {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET4:
          if(c != '\r' && c != '\n') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_TARGET;
            parser->item_offset = finfo->b_used - 1;
            parser->item_length = 1;
          }
          else {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          break;
        case PL_UNIX_SYMLINK_TARGET:
          parser->item_length++;
          if(c == '\r') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_WINDOWSEOL;
          }
          else if(c == '\n') {
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.symlink_target = parser->item_offset;
            result = ftp_pl_insert_finfo(conn, infop);
            if(result) {
              PL_ERROR(conn, result);
              return bufflen;
            }
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
          }
          break;
        case PL_UNIX_SYMLINK_WINDOWSEOL:
          if(c == '\n') {
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.symlink_target = parser->item_offset;
            result = ftp_pl_insert_finfo(conn, infop);
            if(result) {
              PL_ERROR(conn, result);
              return bufflen;
            }
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
          }
          else {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          break;
        }
        break;
      }
      break;
    case OS_TYPE_WIN_NT:
      switch(parser->state.NT.main) {
      case PL_WINNT_DATE:
        parser->item_length++;
        if(parser->item_length < 9) {
          if(!strchr("0123456789-", c)) { /* only simple control */
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
        }
        else if(parser->item_length == 9) {
          if(c == ' ') {
            parser->state.NT.main = PL_WINNT_TIME;
            parser->state.NT.sub.time = PL_WINNT_TIME_PRESPACE;
          }
          else {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
        }
        else {
          PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
          return bufflen;
        }
        break;
      case PL_WINNT_TIME:
        parser->item_length++;
        switch(parser->state.NT.sub.time) {
        case PL_WINNT_TIME_PRESPACE:
          if(!ISSPACE(c)) {
            parser->state.NT.sub.time = PL_WINNT_TIME_TIME;
          }
          break;
        case PL_WINNT_TIME_TIME:
          if(c == ' ') {
            parser->offsets.time = parser->item_offset;
            finfo->b_data[parser->item_offset + parser->item_length -1] = 0;
            parser->state.NT.main = PL_WINNT_DIRORSIZE;
            parser->state.NT.sub.dirorsize = PL_WINNT_DIRORSIZE_PRESPACE;
            parser->item_length = 0;
          }
          else if(!strchr("APM0123456789:", c)) {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          break;
        }
        break;
      case PL_WINNT_DIRORSIZE:
        switch(parser->state.NT.sub.dirorsize) {
        case PL_WINNT_DIRORSIZE_PRESPACE:
          if(c == ' ') {

          }
          else {
            parser->item_offset = finfo->b_used - 1;
            parser->item_length = 1;
            parser->state.NT.sub.dirorsize = PL_WINNT_DIRORSIZE_CONTENT;
          }
          break;
        case PL_WINNT_DIRORSIZE_CONTENT:
          parser->item_length ++;
          if(c == ' ') {
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            if(strcmp("<DIR>", finfo->b_data + parser->item_offset) == 0) {
              finfo->filetype = CURLFILETYPE_DIRECTORY;
              finfo->size = 0;
            }
            else {
              char *endptr;
              finfo->size = curlx_strtoofft(finfo->b_data +
                                            parser->item_offset,
                                            &endptr, 10);
              if(!*endptr) {
                if(finfo->size == CURL_OFF_T_MAX ||
                   finfo->size == CURL_OFF_T_MIN) {
                  if(errno == ERANGE) {
                    PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
                    return bufflen;
                  }
                }
              }
              else {
                PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
                return bufflen;
              }
              /* correct file type */
              parser->file_data->info.filetype = CURLFILETYPE_FILE;
            }

            parser->file_data->info.flags |= CURLFINFOFLAG_KNOWN_SIZE;
            parser->item_length = 0;
            parser->state.NT.main = PL_WINNT_FILENAME;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_PRESPACE;
          }
          break;
        }
        break;
      case PL_WINNT_FILENAME:
        switch(parser->state.NT.sub.filename) {
        case PL_WINNT_FILENAME_PRESPACE:
          if(c != ' ') {
            parser->item_offset = finfo->b_used -1;
            parser->item_length = 1;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_CONTENT;
          }
          break;
        case PL_WINNT_FILENAME_CONTENT:
          parser->item_length++;
          if(c == '\r') {
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_WINEOL;
            finfo->b_data[finfo->b_used - 1] = 0;
          }
          else if(c == '\n') {
            parser->offsets.filename = parser->item_offset;
            finfo->b_data[finfo->b_used - 1] = 0;
            parser->offsets.filename = parser->item_offset;
            result = ftp_pl_insert_finfo(conn, infop);
            if(result) {
              PL_ERROR(conn, result);
              return bufflen;
            }
            parser->state.NT.main = PL_WINNT_DATE;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_PRESPACE;
          }
          break;
        case PL_WINNT_FILENAME_WINEOL:
          if(c == '\n') {
            parser->offsets.filename = parser->item_offset;
            result = ftp_pl_insert_finfo(conn, infop);
            if(result) {
              PL_ERROR(conn, result);
              return bufflen;
            }
            parser->state.NT.main = PL_WINNT_DATE;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_PRESPACE;
          }
          else {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          break;
        }
        break;
      }
      break;
    default:
      return bufflen + 1;
    }

    i++;
  }

  return bufflen;
}